

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_trim_frontAndBackTrimming_fn(int _i)

{
  uint uVar1;
  char *pcVar2;
  char *expr;
  int line;
  char *pcVar3;
  char *pcVar4;
  AString string;
  
  private_ACUtilsTest_AString_constructTestString(&string,"   01   ",8);
  private_ACUtilsTest_AString_reallocFail = 0;
  AString_trim(&string,' ');
  if (string.capacity == 8) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x218);
    if (string.buffer == (char *)0x0) {
      string.size = 0;
      string.buffer = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar2 = "Assertion \'%s\' failed: %s == %#x";
      pcVar3 = "(void*) (string).buffer != NULL";
      pcVar4 = "(void*) (string).buffer";
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x218);
      if (string.buffer == (char *)0x0) {
        string.size = 0x16819b;
        string.buffer = "(null)";
      }
      else {
        uVar1 = (byte)*string.buffer - 0x30;
        if ((uVar1 == 0) && (uVar1 = (byte)string.buffer[1] - 0x31, uVar1 == 0)) {
          uVar1 = (uint)(byte)string.buffer[2];
        }
        if (uVar1 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x218);
          if (string.size == 2) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x218);
            if (private_ACUtilsTest_AString_reallocCount == 0) {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x219);
              (*string.deallocator)(string.buffer);
              return;
            }
            string.buffer = "(0)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar3 = "private_ACUtilsTest_AString_reallocCount == (0)";
            pcVar4 = "private_ACUtilsTest_AString_reallocCount";
            line = 0x219;
            string.size = private_ACUtilsTest_AString_reallocCount;
            goto LAB_001244ea;
          }
          string.buffer = "strlen(\"01\")";
          expr = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar3 = "(string).size == strlen(\"01\")";
          pcVar4 = "(string).size";
          goto LAB_001244e5;
        }
        string.size = 0x15c553;
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar2 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar3 = "(string).buffer == (\"01\")";
      pcVar4 = "(string).buffer";
    }
  }
  else {
    string.buffer = "(8)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar3 = "(string).capacity == (8)";
    pcVar4 = "(string).capacity";
    string.size = string.capacity;
  }
LAB_001244e5:
  line = 0x218;
LAB_001244ea:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,line,expr,pcVar2,pcVar3,pcVar4,string.size,string.buffer);
}

Assistant:

END_TEST
START_TEST(test_AString_trim_frontAndBackTrimming)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("   01   ", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    AString_trim(&string, ' ');
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}